

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  uint uVar1;
  char **fmt;
  bool bVar2;
  bool bVar3;
  LogLevel LVar4;
  int iVar5;
  undefined8 extraout_RAX;
  _Any_data *onError;
  bool listTests;
  allocator<char> local_274;
  allocator<char> local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  char **argv_local;
  char *googleArgv [4];
  string filter;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  code *local_218;
  code *local_210;
  int googleArgc;
  string testFilter;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  string local_168;
  string logLevel;
  PBRTOptions opt;
  
  opt.imageFile._M_dataplus._M_p = (pointer)&opt.imageFile.field_2;
  opt.mseReferenceImage._M_dataplus._M_p = (pointer)&opt.mseReferenceImage.field_2;
  opt.mseReferenceOutput._M_dataplus._M_p = (pointer)&opt.mseReferenceOutput.field_2;
  opt.super_BasicOptions.nThreads = 0;
  opt.super_BasicOptions.seed = 0;
  opt.super_BasicOptions.renderingSpace = CameraWorld;
  opt.logLevel = Error;
  opt.pixelSamples.set = false;
  opt.gpuDevice.set = false;
  opt.imageFile._M_string_length = 0;
  opt.imageFile.field_2._M_local_buf[0] = '\0';
  opt.mseReferenceImage._M_string_length = 0;
  opt.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  opt.debugStart._M_dataplus._M_p = (pointer)&opt.debugStart.field_2;
  opt.mseReferenceOutput._M_string_length = 0;
  opt.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  opt.debugStart._M_string_length = 0;
  opt.debugStart.field_2._M_local_buf[0] = '\0';
  opt.displayServer._M_dataplus._M_p = (pointer)&opt.displayServer.field_2;
  opt.displayServer._M_string_length = 0;
  opt.displayServer.field_2._M_local_buf[0] = '\0';
  opt.cropWindow.set = false;
  opt.pixelBounds.set = false;
  opt.super_BasicOptions.quickRender = false;
  opt.super_BasicOptions.quiet = true;
  opt.super_BasicOptions.recordPixelStatistics = false;
  opt.super_BasicOptions.upgrade = false;
  opt.super_BasicOptions.disablePixelJitter = false;
  opt.super_BasicOptions.disableWavelengthJitter = false;
  opt.super_BasicOptions.forceDiffuse = false;
  opt.super_BasicOptions.useGPU = false;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLevel,"error",(allocator<char> *)&testFilter);
  testFilter._M_dataplus._M_p = (pointer)&testFilter.field_2;
  argv_local = argv + 1;
  testFilter._M_string_length = 0;
  testFilter.field_2._M_local_buf[0] = '\0';
  listTests = false;
  do {
    while( true ) {
      if (*argv_local == (char *)0x0) {
        LVar4 = pbrt::LogLevelFromString(&logLevel);
        opt.logLevel = LVar4;
        pbrt::InitPBRT(&opt);
        googleArgc = 1;
        filter._M_dataplus._M_p = (pointer)&filter.field_2;
        googleArgv[1] = (char *)0x0;
        googleArgv[2] = (char *)0x0;
        googleArgv[3] = (char *)0x0;
        googleArgv[0] = *argv_local;
        filter._M_string_length = 0;
        filter.field_2._M_local_buf[0] = '\0';
        if (testFilter._M_string_length == 0) {
          uVar1 = 1;
        }
        else {
          pbrt::StringPrintf<std::__cxx11::string&>
                    (&local_168,(pbrt *)"--gtest_filter=%s",(char *)&testFilter,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     filter._M_dataplus._M_p);
          std::__cxx11::string::operator=((string *)&filter,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          googleArgc = 2;
          googleArgv[1] = filter._M_dataplus._M_p;
          uVar1 = 2;
        }
        if (listTests == true) {
          googleArgc = uVar1 + 1;
          googleArgv[uVar1] = "--gtest_list_tests";
        }
        testing::InitGoogleTest(&googleArgc,googleArgv);
        iVar5 = RUN_ALL_TESTS();
        pbrt::CleanupPBRT();
        std::__cxx11::string::~string((string *)&filter);
        std::__cxx11::string::~string((string *)&testFilter);
        std::__cxx11::string::~string((string *)&logLevel);
        pbrt::PBRTOptions::~PBRTOptions(&opt);
        return iVar5;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)googleArgv,"list-tests",&local_271);
      local_1a8._M_unused._M_object = (void *)0x0;
      local_1a8._8_8_ = 0;
      local_190 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_invoke;
      local_198 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_manager;
      bVar2 = pbrt::ParseArg<bool*>
                        (&argv_local,(string *)googleArgv,&listTests,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_1a8);
      if (!bVar2) break;
LAB_002f8096:
      std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
      std::__cxx11::string::~string((string *)googleArgv);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&filter,"log-level",&local_272);
    local_228._M_allocated_capacity = 0;
    local_228._8_8_ = 0;
    local_210 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_invoke;
    local_218 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_manager;
    bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,&filter,&logLevel,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_228);
    if (bVar2) {
      std::_Function_base::~_Function_base((_Function_base *)&local_228);
      std::__cxx11::string::~string((string *)&filter);
      goto LAB_002f8096;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"nthreads",&local_273);
    local_1c8._M_unused._M_object = (void *)0x0;
    local_1c8._8_8_ = 0;
    local_1b0 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_invoke;
    local_1b8 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_manager;
    onError = &local_1c8;
    bVar2 = pbrt::ParseArg<int*>
                      (&argv_local,&local_168,(int *)&opt,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)onError);
    bVar3 = true;
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&googleArgc,"test-filter",&local_274);
      local_188._M_unused._M_object = (void *)0x0;
      local_188._8_8_ = 0;
      local_170 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_invoke;
      local_178 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_manager;
      onError = &local_188;
      bVar3 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,(string *)&googleArgc,&testFilter,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_188);
      std::_Function_base::~_Function_base((_Function_base *)&local_188);
      std::__cxx11::string::~string((string *)&googleArgc);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_168);
    std::_Function_base::~_Function_base((_Function_base *)&local_228);
    std::__cxx11::string::~string((string *)&filter);
    std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
    std::__cxx11::string::~string((string *)googleArgv);
    fmt = argv_local;
    if (bVar3 == false) {
      __s1 = *argv_local;
      iVar5 = strcmp(__s1,"--help");
      if ((iVar5 == 0) || (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)googleArgv,"",(allocator<char> *)&filter);
      }
      else {
        pbrt::StringPrintf<char*&>
                  ((string *)googleArgv,(pbrt *)"argument \"%s\" unknown",(char *)fmt,
                   (char **)onError);
      }
      usage((string *)googleArgv);
      std::__cxx11::string::~string((string *)&filter);
      std::__cxx11::string::~string((string *)&testFilter);
      std::__cxx11::string::~string((string *)&logLevel);
      pbrt::PBRTOptions::~PBRTOptions(&opt);
      _Unwind_Resume(extraout_RAX);
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv) {
    PBRTOptions opt;
    opt.quiet = true;
    std::string logLevel = "error";
    std::string testFilter;
    bool listTests = false;

    char **origArgv = argv;
    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        if (ParseArg(&argv, "list-tests", &listTests, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "nthreads", &opt.nThreads, onError) ||
            ParseArg(&argv, "test-filter", &testFilter, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    opt.logLevel = LogLevelFromString(logLevel);

    InitPBRT(opt);

    int googleArgc = 1;
    const char *googleArgv[4] = {};
    googleArgv[0] = argv[0];
    std::string filter;
    if (!testFilter.empty()) {
        filter = StringPrintf("--gtest_filter=%s", testFilter);
        googleArgv[googleArgc++] = filter.c_str();
    }
    if (listTests)
        googleArgv[googleArgc++] = "--gtest_list_tests";

    testing::InitGoogleTest(&googleArgc, (char **)googleArgv);

    int ret = RUN_ALL_TESTS();

    CleanupPBRT();

    return ret;
}